

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-walk-handles.c
# Opt level: O1

int run_test_walk_handles(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  uv_timer_t *puVar3;
  uv_timer_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_18 [16];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer);
  local_18._8_8_ = SEXT48(iVar1);
  local_18._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)local_18._8_8_ == (uv_loop_t *)0x0) {
    iVar1 = uv_timer_start(&timer,timer_cb,1,0);
    local_18._8_8_ = SEXT48(iVar1);
    local_18._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_18._8_8_ != (uv_loop_t *)0x0) goto LAB_001e334a;
    local_18._8_8_ = SEXT48(seen_timer_handle);
    local_18._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_18._8_8_ != (uv_loop_t *)0x0) goto LAB_001e3357;
    iVar1 = uv_run(uVar2,0);
    local_18._8_8_ = SEXT48(iVar1);
    local_18._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_18._8_8_ != (uv_loop_t *)0x0) goto LAB_001e3364;
    local_18._8_8_ = (uv_loop_t *)0x1;
    local_18._0_8_ = SEXT48(seen_timer_handle);
    if ((uv_loop_t *)local_18._0_8_ != (uv_loop_t *)0x1) goto LAB_001e3371;
    seen_timer_handle = 0;
    uv_walk(uVar2,walk_cb,magic_cookie);
    local_18._8_8_ = SEXT48(seen_timer_handle);
    local_18._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_18._8_8_ == (uv_loop_t *)0x0) {
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_18._8_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(uVar2);
      local_18._0_8_ = SEXT48(iVar1);
      if (local_18._8_8_ == local_18._0_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001e338b;
    }
  }
  else {
    run_test_walk_handles_cold_1();
LAB_001e334a:
    run_test_walk_handles_cold_2();
LAB_001e3357:
    run_test_walk_handles_cold_3();
LAB_001e3364:
    run_test_walk_handles_cold_4();
LAB_001e3371:
    run_test_walk_handles_cold_5();
  }
  run_test_walk_handles_cold_6();
LAB_001e338b:
  puVar3 = (uv_timer_t *)local_18;
  puVar4 = (uv_timer_t *)(local_18 + 8);
  run_test_walk_handles_cold_7();
  if (puVar4 == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    iVar1 = uv_close(&timer,0);
    return iVar1;
  }
  timer_cb_cold_1();
  if (puVar3 == (uv_timer_t *)magic_cookie) {
    puVar3 = puVar4;
    if (puVar4 == &timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return extraout_EAX;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(walk_handles) {
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, timer_cb, 1, 0);
  ASSERT_OK(r);

  /* Start event loop, expect to see the timer handle in walk_cb. */
  ASSERT_OK(seen_timer_handle);
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, seen_timer_handle);

  /* Loop is finished, walk_cb should not see our timer handle. */
  seen_timer_handle = 0;
  uv_walk(loop, walk_cb, magic_cookie);
  ASSERT_OK(seen_timer_handle);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}